

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test::testBody
          (TEST_MockParameterTest_outputParameterWithIgnoredParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  long lVar6;
  long lVar7;
  int retval;
  int param;
  SimpleString local_58;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  
  param = 1;
  retval = 2;
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_38,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_38);
  SimpleString::SimpleString(&local_48,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_48,&param,4);
  (**(code **)(*plVar3 + 0x48))(plVar3);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_58);
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_38,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_38);
  SimpleString::SimpleString(&local_48,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_48,&retval);
  SimpleString::SimpleString(&local_28,"other");
  (**(code **)(*plVar3 + 0x40))(plVar3,&local_28,1);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_58);
  pUVar4 = UtestShell::getCurrent();
  lVar6 = (long)param;
  lVar7 = (long)retval;
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,lVar6,lVar7,"LONGS_EQUAL(param, retval) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x359,pTVar5);
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_58);
  return;
}

Assistant:

TEST(MockParameterTest, outputParameterWithIgnoredParameters)
{
    int param = 1;
    int retval = 2;

    mock().expectOneCall("foo").withOutputParameterReturning("bar", &param, sizeof(param)).ignoreOtherParameters();
    mock().actualCall("foo").withOutputParameter("bar", &retval).withParameter("other", 1);

    LONGS_EQUAL(param, retval);

    mock().checkExpectations();
}